

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O3

Literal * __thiscall
wasm::Literal::divF64x2(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  Type *this_00;
  bool bVar1;
  bool bVar2;
  long lVar3;
  Literal *this_01;
  Type *__return_storage_ptr___00;
  undefined1 local_c8 [8];
  LaneArray<2> other_lanes;
  Literal local_80;
  undefined1 local_68 [8];
  LaneArray<2> lanes;
  
  this_01 = (Literal *)local_68;
  lanes._M_elems[1].type.id = (uintptr_t)__return_storage_ptr__;
  getLanesF64x2((LaneArray<2> *)this_01,this);
  __return_storage_ptr___00 = (Type *)local_c8;
  getLanesF64x2((LaneArray<2> *)__return_storage_ptr___00,other);
  this_00 = &other_lanes._M_elems[1].type;
  bVar1 = true;
  do {
    bVar2 = bVar1;
    div(&local_80,(int)this_01,(int)__return_storage_ptr___00);
    Literal((Literal *)this_00,&local_80);
    ~Literal(this_01);
    Literal(this_01,(Literal *)this_00);
    ~Literal((Literal *)this_00);
    ~Literal(&local_80);
    __return_storage_ptr___00 = &other_lanes._M_elems[0].type;
    this_01 = (Literal *)&lanes._M_elems[0].type;
    bVar1 = false;
  } while (bVar2);
  Literal((Literal *)lanes._M_elems[1].type.id,(LaneArray<2> *)local_68);
  lVar3 = 0x18;
  do {
    ~Literal((Literal *)(local_c8 + lVar3));
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  lVar3 = 0x18;
  do {
    ~Literal((Literal *)(local_68 + lVar3));
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  return (Literal *)lanes._M_elems[1].type.id;
}

Assistant:

Literal Literal::divF64x2(const Literal& other) const {
  return binary<2, &Literal::getLanesF64x2, &Literal::div>(*this, other);
}